

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testWithTranslateRotateAndScale<double>(M44d *m)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint __line;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  Rand48 rand;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> from;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> to;
  vector<double,_std::allocator<double>_> weights;
  double local_158;
  double dStack_150;
  double local_148;
  Vec3<double> local_138;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Vec3<double> local_b8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Testing with known translate/rotate/scale matrix\n");
  Imath_2_5::operator<<(poVar4,m);
  rand._state[0] = 0xd35a;
  rand._state[1] = 0xc826;
  rand._state[2] = 0xd35a;
  from.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  from.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  from.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::operator<<((ostream *)&std::cout,"numPoints: ");
  std::ostream::flush();
  lVar7 = 1;
  do {
    if (lVar7 == 10) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&weights.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
      ~_Vector_base(&from.
                     super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                   );
      return;
    }
    dVar2 = (double)Imath_2_5::erand48(rand._state);
    dVar3 = (double)Imath_2_5::erand48(rand._state);
    local_b8.z = (double)Imath_2_5::erand48(rand._state);
    local_b8.x = dVar2;
    local_b8.y = dVar3;
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&from,
               &local_b8);
    local_b8.x = (double)Imath_2_5::erand48(rand._state);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&weights,&local_b8.x);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar4," ");
    to.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar6 = 0;
    uVar8 = 0;
    while( true ) {
      uVar5 = ((long)from.
                     super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)from.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      if (uVar5 <= uVar8) break;
      Imath_2_5::operator*
                ((Vec3<double> *)
                 ((long)&(from.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar6),m);
      std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
      emplace_back<Imath_2_5::Vec3<double>>
                ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&to,
                 &local_b8);
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x18;
    }
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((Vec3 *)&local_b8,
               (Vec3 *)from.
                       super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               &(to.
                 super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->x,
               (ulong)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,SUB81(uVar5,0));
    lVar6 = 0;
    uVar8 = 0;
    while( true ) {
      uVar5 = ((long)from.
                     super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)from.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      if (uVar5 <= uVar8) break;
      Imath_2_5::operator*
                ((Vec3<double> *)
                 ((long)&(from.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar6),
                 (Matrix44<double> *)&local_b8);
      local_138.z = local_148 -
                    *(double *)
                     ((long)&(to.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->z + lVar6);
      pdVar1 = (double *)
               ((long)&(to.
                        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->x + lVar6);
      local_138.x = local_158 - *pdVar1;
      local_138.y = dStack_150 - pdVar1[1];
      dVar2 = Imath_2_5::Vec3<double>::length(&local_138);
      if (9.999999747378752e-05 <= dVar2) {
        __line = 0x75;
        goto LAB_0013404c;
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x18;
    }
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((Vec3 *)&local_138,
               (Vec3 *)from.
                       super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (ulong)to.
                      super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,SUB81(uVar5,0));
    local_b8.x = local_138.x;
    local_b8.y = local_138.y;
    local_b8.z = local_138.z;
    uStack_a0 = uStack_120;
    local_98 = local_118;
    uStack_90 = uStack_110;
    local_88 = local_108;
    uStack_80 = uStack_100;
    local_78 = local_f8;
    uStack_70 = uStack_f0;
    local_68 = local_e8;
    uStack_60 = uStack_e0;
    local_58 = local_d8;
    uStack_50 = uStack_d0;
    local_48 = local_c8;
    uStack_40 = uStack_c0;
    lVar6 = 0;
    for (uVar8 = 0;
        uVar8 < (ulong)(((long)from.
                               super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)from.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar8 = uVar8 + 1)
    {
      Imath_2_5::operator*
                ((Vec3<double> *)
                 ((long)&(from.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar6),
                 (Matrix44<double> *)&local_b8);
      local_138.z = local_148 -
                    *(double *)
                     ((long)&(to.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->z + lVar6);
      pdVar1 = (double *)
               ((long)&(to.
                        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->x + lVar6);
      local_138.x = local_158 - *pdVar1;
      local_138.y = dStack_150 - pdVar1[1];
      dVar2 = Imath_2_5::Vec3<double>::length(&local_138);
      if (9.999999747378752e-05 <= dVar2) {
        __line = 0x7a;
LAB_0013404c:
        __assert_fail("(from[i] * res - to[i]).length() < eps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                      ,__line,
                      "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]");
      }
      lVar6 = lVar6 + 0x18;
    }
    std::_Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
    ~_Vector_base(&to.
                   super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                 );
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand(5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3> from;
    std::vector<T> weights;

    const float eps = 1e-4;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(rand.nextf(), rand.nextf(), rand.nextf()));
        weights.push_back (rand.nextf());
        std::cout << from.size() << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size(); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);
    }
    std::cout << "  OK\n";
}